

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileContainingSymbol
          (DescriptorPool *this,ConstStringParam symbol_name)

{
  byte bVar1;
  Tables *pTVar2;
  pointer pcVar3;
  size_t sVar4;
  bool bVar5;
  char *str;
  char *pcVar6;
  __node_base_ptr p_Var7;
  _Hash_node_base *p_Var8;
  FileDescriptor *pFVar9;
  __hash_code _Var10;
  char *pcVar11;
  StringPiece SVar12;
  MutexLockMaybe lock;
  key_type local_70;
  MutexLockMaybe local_68;
  Symbol local_60;
  SymbolBase local_58 [8];
  pointer local_50;
  size_t local_48;
  
  internal::MutexLockMaybe::MutexLockMaybe(&local_68,this->mutex_);
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_symbols_)._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_files_)._M_h);
  }
  pTVar2 = (this->tables_)._M_t.
           super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl;
  pcVar3 = (symbol_name->_M_dataplus)._M_p;
  sVar4 = symbol_name->_M_string_length;
  if ((long)sVar4 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(sVar4,"string length exceeds max size");
  }
  local_58[0].symbol_type_ = '\n';
  local_70.ptr_ = local_58;
  local_60.ptr_ = local_58;
  local_50 = pcVar3;
  local_48 = sVar4;
  SVar12 = Symbol::full_name(&local_60);
  pcVar6 = SVar12.ptr_;
  if ((long)SVar12.length_ < 1) {
    _Var10 = 0;
  }
  else {
    pcVar11 = pcVar6 + SVar12.length_;
    _Var10 = 0;
    do {
      _Var10 = (long)*pcVar6 + _Var10 * 5;
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 < pcVar11);
  }
  p_Var7 = std::
           _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_before_node
                     (&(pTVar2->symbols_by_name_)._M_h,
                      _Var10 % *(size_type *)((long)&(pTVar2->symbols_by_name_)._M_h + 8),&local_70,
                      _Var10);
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var8 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
  }
  else {
    p_Var8 = p_Var7->_M_nxt + 1;
    if (p_Var7->_M_nxt == (_Hash_node_base *)0x0) {
      p_Var8 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
    }
  }
  p_Var8 = p_Var8->_M_nxt;
  if (p_Var8 == (_Hash_node_base *)0x0) {
LAB_0034650e:
    if ((this->underlay_ != (DescriptorPool *)0x0) &&
       (pFVar9 = FindFileContainingSymbol(this->underlay_,symbol_name),
       pFVar9 != (FileDescriptor *)0x0)) goto LAB_00346612;
    SVar12.ptr_ = (symbol_name->_M_dataplus)._M_p;
    SVar12.length_ = symbol_name->_M_string_length;
    if ((long)symbol_name->_M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (symbol_name->_M_string_length,"string length exceeds max size");
    }
    bVar5 = TryFindSymbolInFallbackDatabase(this,SVar12);
    if (bVar5) {
      pTVar2 = (this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
               _M_head_impl;
      pcVar3 = (symbol_name->_M_dataplus)._M_p;
      sVar4 = symbol_name->_M_string_length;
      if ((long)sVar4 < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (sVar4,"string length exceeds max size");
      }
      local_58[0].symbol_type_ = '\n';
      local_70.ptr_ = local_58;
      local_60.ptr_ = local_58;
      local_50 = pcVar3;
      local_48 = sVar4;
      SVar12 = Symbol::full_name(&local_60);
      pcVar6 = SVar12.ptr_;
      if ((long)SVar12.length_ < 1) {
        _Var10 = 0;
      }
      else {
        pcVar11 = pcVar6 + SVar12.length_;
        _Var10 = 0;
        do {
          _Var10 = (long)*pcVar6 + _Var10 * 5;
          pcVar6 = pcVar6 + 1;
        } while (pcVar6 < pcVar11);
      }
      p_Var7 = std::
               _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::_M_find_before_node
                         (&(pTVar2->symbols_by_name_)._M_h,
                          _Var10 % *(size_type *)((long)&(pTVar2->symbols_by_name_)._M_h + 8),
                          &local_70,_Var10);
      p_Var8 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
      if ((p_Var7 != (__node_base_ptr)0x0) && (p_Var7->_M_nxt != (_Hash_node_base *)0x0)) {
        p_Var8 = p_Var7->_M_nxt + 1;
      }
      p_Var8 = p_Var8->_M_nxt;
      if (p_Var8 != (_Hash_node_base *)0x0) {
        bVar1 = *(byte *)&p_Var8->_M_nxt;
        pFVar9 = (FileDescriptor *)0x0;
        if (9 < bVar1) goto LAB_00346612;
        if ((0x296U >> (bVar1 & 0x1f) & 1) == 0) {
          if ((0x128U >> (bVar1 & 0x1f) & 1) == 0) goto LAB_00346612;
          goto LAB_003464f9;
        }
        goto LAB_003464fd;
      }
    }
    pFVar9 = (FileDescriptor *)0x0;
  }
  else {
    bVar1 = *(byte *)&p_Var8->_M_nxt;
    pFVar9 = (FileDescriptor *)0x0;
    if (9 < bVar1) goto LAB_00346612;
    if ((0x296U >> (bVar1 & 0x1f) & 1) == 0) {
      if ((0x128U >> (bVar1 & 0x1f) & 1) == 0) {
        if (bVar1 != 0) goto LAB_00346612;
        goto LAB_0034650e;
      }
LAB_003464f9:
      p_Var8 = p_Var8[2]._M_nxt;
    }
LAB_003464fd:
    pFVar9 = (FileDescriptor *)p_Var8[2]._M_nxt;
  }
LAB_00346612:
  if ((pthread_mutex_t *)local_68.mu_ != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)local_68.mu_);
  }
  return pFVar9;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileContainingSymbol(
    ConstStringParam symbol_name) const {
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }
  Symbol result = tables_->FindSymbol(symbol_name);
  if (!result.IsNull()) return result.GetFile();
  if (underlay_ != nullptr) {
    const FileDescriptor* file_result =
        underlay_->FindFileContainingSymbol(symbol_name);
    if (file_result != nullptr) return file_result;
  }
  if (TryFindSymbolInFallbackDatabase(symbol_name)) {
    result = tables_->FindSymbol(symbol_name);
    if (!result.IsNull()) return result.GetFile();
  }
  return nullptr;
}